

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O0

uint32 prune_subtrees(dtree_node_t *node)

{
  uint32 uVar1;
  uint32 uVar2;
  uint32 n_pruned;
  dtree_node_t *node_local;
  
  if ((node->y == (dtree_node_str *)0x0) && (node->n == (dtree_node_str *)0x0)) {
    node_local._4_4_ = 0;
  }
  else {
    uVar1 = cnt_node(node->y);
    uVar2 = cnt_node(node->n);
    node_local._4_4_ = uVar1 + uVar2;
    prune_subtrees(node->y);
    node->y = (dtree_node_str *)0x0;
    prune_subtrees(node->n);
    node->n = (dtree_node_str *)0x0;
  }
  return node_local._4_4_;
}

Assistant:

uint32
prune_subtrees(dtree_node_t *node)
{
    uint32 n_pruned;

    if (!IS_LEAF(node)) {
	n_pruned = cnt_node(node->y) + cnt_node(node->n);
	    
	prune_subtrees(node->y); node->y = NULL;
	prune_subtrees(node->n); node->n = NULL;

	return n_pruned;
    }
    else {
	/* it is a leaf node; nothing to do */
	return 0;
    }
}